

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcommandlineparser.cpp
# Opt level: O2

bool __thiscall QCommandLineParser::addOption(QCommandLineParser *this,QCommandLineOption *option)

{
  bool bVar1;
  ushort *puVar2;
  long lVar3;
  QString *name;
  QString *pQVar4;
  long in_FS_OFFSET;
  qsizetype offset;
  QMessageLogger local_68;
  QArrayDataPointer<QString> local_48;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  local_48.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_48.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_48.ptr = (QString *)&DAT_aaaaaaaaaaaaaaaa;
  QCommandLineOption::names((QStringList *)&local_48,option);
  if ((undefined1 *)local_48.size == (undefined1 *)0x0) {
LAB_0038e1e9:
    bVar1 = false;
  }
  else {
    pQVar4 = local_48.ptr;
    for (lVar3 = local_48.size * 0x18; lVar3 != 0; lVar3 = lVar3 + -0x18) {
      bVar1 = QHash<QString,_long_long>::contains(&this->d->nameHash,pQVar4);
      if (bVar1) {
        local_68.context.version = 2;
        local_68.context.function._4_4_ = 0;
        local_68.context.line = 0;
        local_68.context.file._0_4_ = 0;
        local_68.context._12_8_ = 0;
        local_68.context.category = "default";
        puVar2 = QString::utf16(pQVar4);
        QMessageLogger::warning
                  (&local_68,"QCommandLineParser: option already added: \"%ls\"",puVar2);
        goto LAB_0038e1e9;
      }
      pQVar4 = pQVar4 + 1;
    }
    QList<QCommandLineOption>::emplaceBack<QCommandLineOption_const&>
              (&this->d->commandLineOptionList,option);
    local_68.context._0_8_ = (this->d->commandLineOptionList).d.size + -1;
    pQVar4 = local_48.ptr;
    for (lVar3 = local_48.size * 0x18; lVar3 != 0; lVar3 = lVar3 + -0x18) {
      QHash<QString,long_long>::emplace<long_long_const&>
                ((QHash<QString,long_long> *)&this->d->nameHash,pQVar4,(longlong *)&local_68);
      pQVar4 = pQVar4 + 1;
    }
    bVar1 = true;
  }
  QArrayDataPointer<QString>::~QArrayDataPointer(&local_48);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return bVar1;
  }
  __stack_chk_fail();
}

Assistant:

bool QCommandLineParser::addOption(const QCommandLineOption &option)
{
    const QStringList optionNames = option.names();

    if (!optionNames.isEmpty()) {
        for (const QString &name : optionNames) {
            if (d->nameHash.contains(name)) {
                qWarning("QCommandLineParser: option already added: \"%ls\"", qUtf16Printable(name));
                return false;
            }
        }

        d->commandLineOptionList.append(option);

        const qsizetype offset = d->commandLineOptionList.size() - 1;
        for (const QString &name : optionNames)
            d->nameHash.insert(name, offset);

        return true;
    }

    return false;
}